

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O3

void __thiscall
duckdb::BindContext::AddGenericBinding
          (BindContext *this,idx_t index,string *alias,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names,vector<duckdb::LogicalType,_true> *types)

{
  pointer pcVar1;
  _Head_base<0UL,_duckdb::Binding_*,_false> local_c0;
  BindingType local_b4;
  idx_t local_b0;
  string local_a8;
  BindingAlias local_88;
  
  local_b4 = BASE;
  pcVar1 = (alias->_M_dataplus)._M_p;
  local_b0 = index;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar1,pcVar1 + alias->_M_string_length);
  BindingAlias::BindingAlias(&local_88,&local_a8);
  make_uniq<duckdb::Binding,duckdb::BindingType,duckdb::BindingAlias,duckdb::vector<duckdb::LogicalType,true>const&,duckdb::vector<std::__cxx11::string,true>const&,unsigned_long&>
            ((duckdb *)&local_c0,&local_b4,&local_88,types,names,&local_b0);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Binding,std::default_delete<duckdb::Binding>,true>,std::allocator<duckdb::unique_ptr<duckdb::Binding,std::default_delete<duckdb::Binding>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Binding,std::default_delete<duckdb::Binding>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Binding,std::default_delete<duckdb::Binding>,true>,std::allocator<duckdb::unique_ptr<duckdb::Binding,std::default_delete<duckdb::Binding>,true>>>
              *)&this->bindings_list,
             (unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *)&local_c0);
  if (local_c0._M_head_impl != (Binding *)0x0) {
    (*(local_c0._M_head_impl)->_vptr_Binding[1])();
  }
  local_c0._M_head_impl = (Binding *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.alias._M_dataplus._M_p != &local_88.alias.field_2) {
    operator_delete(local_88.alias._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.schema._M_dataplus._M_p != &local_88.schema.field_2) {
    operator_delete(local_88.schema._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.catalog._M_dataplus._M_p != &local_88.catalog.field_2) {
    operator_delete(local_88.catalog._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void BindContext::AddGenericBinding(idx_t index, const string &alias, const vector<string> &names,
                                    const vector<LogicalType> &types) {
	AddBinding(make_uniq<Binding>(BindingType::BASE, BindingAlias(alias), types, names, index));
}